

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffupck(fitsfile *fptr,int *status)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  double tdouble;
  unsigned_long dsum;
  unsigned_long sum;
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  long nrec;
  char local_178 [4];
  int tstatus;
  char datasum [71];
  char local_128 [8];
  char checksum [71];
  char local_d8 [8];
  char comm [73];
  char chkcomm [73];
  char datestr [20];
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    ffgstm(chkcomm + 0x48,(int *)0x0,status);
    strcpy(comm + 0x48,"HDU checksum updated ");
    strcat(comm + 0x48,chkcomm + 0x48);
    iVar1 = ffgkys(fptr,"DATASUM",local_178,local_d8,status);
    if (iVar1 == 0xca) {
      ffpmsg("DATASUM keyword not found (ffupck");
      fptr_local._4_4_ = *status;
    }
    else {
      dVar3 = atof(local_178);
      uVar2 = (long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f;
      iVar1 = ffghadll(fptr,&datastart,&dataend,(LONGLONG *)&sum,status);
      if (iVar1 < 1) {
        nrec._4_4_ = *status;
        iVar1 = ffgkys(fptr,"CHECKSUM",local_128,local_d8,status);
        if (iVar1 == 0xca) {
          *status = nrec._4_4_;
          strcpy(local_128,"0000000000000000");
          ffpkys(fptr,"CHECKSUM",local_128,comm + 0x48,status);
        }
        else {
          iVar1 = ffwend(fptr,status);
          if (0 < iVar1) {
            return *status;
          }
          ffmbyt(fptr,datastart,0,status);
          headstart = (dataend - datastart) / 0xb40;
          dsum = uVar2;
          iVar1 = ffcsum(fptr,headstart,&dsum,status);
          if (0 < iVar1) {
            return *status;
          }
          if ((dsum == 0) || (dsum == 0xffffffff)) {
            return *status;
          }
          ffmkys(fptr,"CHECKSUM","0000000000000000",comm + 0x48,status);
        }
        ffmbyt(fptr,datastart,0,status);
        headstart = (dataend - datastart) / 0xb40;
        dsum = uVar2;
        iVar1 = ffcsum(fptr,headstart,&dsum,status);
        if (iVar1 < 1) {
          ffesum(dsum,1,local_128);
          ffmkys(fptr,"CHECKSUM",local_128,"&",status);
          fptr_local._4_4_ = *status;
        }
        else {
          fptr_local._4_4_ = *status;
        }
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffupck(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *status)         /* IO - error status                      */
/*
   Update the CHECKSUM keyword value.  This assumes that the DATASUM
   keyword exists and has the correct value.
*/
{
    char datestr[20], chkcomm[FLEN_COMMENT], comm[FLEN_COMMENT];
    char checksum[FLEN_VALUE], datasum[FLEN_VALUE];
    int tstatus;
    long nrec;
    LONGLONG headstart, datastart, dataend;
    unsigned long sum, dsum;
    double tdouble;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* generate current date string and construct the keyword comments */
    ffgstm(datestr, NULL, status);
    strcpy(chkcomm, "HDU checksum updated ");
    strcat(chkcomm, datestr);

    /* get the DATASUM keyword and convert it to a unsigned long */
    if (ffgkys(fptr, "DATASUM", datasum, comm, status) == KEY_NO_EXIST)
    {
        ffpmsg("DATASUM keyword not found (ffupck");
        return(*status);
    }

    tdouble = atof(datasum); /* read as a double as a workaround */
    dsum = (unsigned long) tdouble;

    /* get size of the HDU */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    /* get the checksum keyword, if it exists */
    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", checksum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        strcpy(checksum, "0000000000000000");
        ffpkys(fptr, "CHECKSUM", checksum, chkcomm, status);
    }
    else
    {
        /* check if CHECKSUM is still OK */
        /* rewrite END keyword and following blank fill */
        if (ffwend(fptr, status) > 0)
            return(*status);

        /* move to the start of the header */
        ffmbyt(fptr, headstart, REPORT_EOF, status);

        /* accumulate the header checksum into the previous data checksum */
        nrec = (long) ((datastart - headstart) / 2880);
        sum = dsum;
        if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

        if (sum == 0 || sum == 0xFFFFFFFF)
           return(*status);    /* CHECKSUM is already correct */

        /* Zero the CHECKSUM and recompute the new value */
        ffmkys(fptr, "CHECKSUM", "0000000000000000", chkcomm, status);
    }

    /* move to the start of the header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);

    /* accumulate the header checksum into the previous data checksum */
    nrec = (long) ((datastart - headstart) / 2880);
    sum = dsum;
    if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

    /* encode the COMPLEMENT of the checksum into a 16-character string */
    ffesum(sum, TRUE, checksum);

    /* update the CHECKSUM keyword value with the new string */
    ffmkys(fptr, "CHECKSUM", checksum, "&", status);

    return(*status);
}